

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O2

string * czh::utils::prettify_string(string *__return_storage_ptr__,string *buffer,int k)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__p;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __p = &ret.field_2;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  iVar2 = (int)buffer->_M_string_length;
  uVar3 = k + iVar2;
  ret._M_dataplus._M_p = (pointer)__p;
  if ((int)uVar3 < 0x16 && -1 < k) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&ret,buffer);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (&ret,(const_iterator)(ret._M_dataplus._M_p + ret._M_string_length),
               (long)(int)(uVar3 - 1),'0');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&ret,".0");
  }
  else if (uVar3 - 1 < 0x15) {
    __beg._M_current = (buffer->_M_dataplus)._M_p;
    std::__cxx11::string::
    insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&ret,(const_iterator)__p,__beg,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(__beg._M_current + uVar3));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&ret,'.');
    pcVar1 = (buffer->_M_dataplus)._M_p;
    std::__cxx11::string::
    insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&ret,(const_iterator)(ret._M_dataplus._M_p + ret._M_string_length),
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pcVar1 + uVar3),
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(pcVar1 + buffer->_M_string_length));
  }
  else if (uVar3 + 5 < 6) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&ret,"0.");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (&ret,(const_iterator)(ret._M_dataplus._M_p + ret._M_string_length),(ulong)-uVar3,'0')
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&ret,buffer);
  }
  else {
    if (iVar2 == 1) {
      std::operator+(&local_50,buffer,"e");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&ret,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&ret,*(buffer->_M_dataplus)._M_p);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&ret,".");
      pcVar1 = (buffer->_M_dataplus)._M_p;
      std::__cxx11::string::
      insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)&ret,(const_iterator)(ret._M_dataplus._M_p + ret._M_string_length),
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(pcVar1 + 1),
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(pcVar1 + iVar2));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&ret,'e');
    }
    fill_exponent(uVar3 - 1,&ret);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret._M_dataplus._M_p == __p) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ret.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = ret._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = ret._M_string_length;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  ret._M_dataplus._M_p = (pointer)__p;
  std::__cxx11::string::~string((string *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string prettify_string(const std::string &buffer, int k)
  {
    std::string ret;
    int end_pos = static_cast<int>(buffer.size());
    int nb_digits = end_pos;
    int kk = nb_digits + k;
    if (nb_digits <= kk && kk <= 21)
    {
      ret = buffer;
      ret.insert(ret.end(), kk - 1, '0');
      ret += ".0";
    }
    else if (0 < kk && kk <= 21)
    {
      ret.insert(ret.end(), buffer.begin(), buffer.begin() + kk);
      ret += '.';
      ret.insert(ret.end(), buffer.begin() + kk, buffer.end());
    }
    else if (-6 < kk && kk <= 0)
    {
      ret = "0.";
      ret.insert(ret.end(), -kk, '0');
      ret += buffer;
    }
    else if (nb_digits == 1)
    {
      ret = buffer + "e";
      fill_exponent(kk - 1, ret);
    }
    else
    {
      ret = buffer[0];
      ret += ".";
      ret.insert(ret.end(), buffer.begin() + 1, buffer.begin() + nb_digits);
      ret += 'e';
      fill_exponent(kk - 1, ret);
    }
    return std::move(ret);
  }